

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

void prepare_close_job(cio_websocket *websocket,cio_websocket_status_code status_code,
                      uint8_t *reason,size_t reason_length,cio_websocket_write_handler_t handler,
                      void *handler_context,cio_buffered_stream_write_handler_t stream_handler)

{
  uint16_t uVar1;
  size_t local_58;
  size_t copy_len;
  size_t close_buffer_length;
  uint16_t ws_status_code;
  void *handler_context_local;
  cio_websocket_write_handler_t handler_local;
  size_t reason_length_local;
  uint8_t *reason_local;
  cio_websocket_status_code status_code_local;
  cio_websocket *websocket_local;
  
  copy_len = 2;
  uVar1 = cio_htobe16((uint16_t)status_code);
  *(uint16_t *)(websocket->ws_private).close_buffer.buffer = uVar1;
  if (reason != (uint8_t *)0x0) {
    local_58 = reason_length;
    if (0x7a < reason_length) {
      local_58 = 0x7b;
    }
    memcpy((websocket->ws_private).close_buffer.buffer + 2,reason,local_58);
    copy_len = local_58 + 2;
  }
  cio_write_buffer_head_init(&(websocket->ws_private).close_buffer.wb_head);
  cio_write_buffer_element_init
            (&(websocket->ws_private).close_buffer.write_buffer,
             (websocket->ws_private).close_buffer.buffer,copy_len);
  cio_write_buffer_queue_tail
            (&(websocket->ws_private).close_buffer.wb_head,
             &(websocket->ws_private).close_buffer.write_buffer);
  (websocket->ws_private).write_close_job.wbh = &(websocket->ws_private).close_buffer.wb_head;
  (websocket->ws_private).write_close_job.handler = handler;
  (websocket->ws_private).write_close_job.handler_context = handler_context;
  (websocket->ws_private).write_close_job.frame_type = CIO_WEBSOCKET_CLOSE_FRAME;
  (websocket->ws_private).write_close_job.last_frame = true;
  (websocket->ws_private).write_close_job.stream_handler = stream_handler;
  return;
}

Assistant:

static void prepare_close_job(struct cio_websocket *websocket, enum cio_websocket_status_code status_code, const uint8_t *reason, size_t reason_length, cio_websocket_write_handler_t handler, void *handler_context, cio_buffered_stream_write_handler_t stream_handler)
{
	uint16_t ws_status_code = (uint16_t)status_code;
	size_t close_buffer_length = sizeof(ws_status_code);
	ws_status_code = cio_htobe16(ws_status_code);
	memcpy(websocket->ws_private.close_buffer.buffer, &ws_status_code, sizeof(ws_status_code));
	if (reason != NULL) {
		size_t copy_len = CIO_MIN(reason_length, sizeof(websocket->ws_private.close_buffer.buffer) - sizeof(ws_status_code));
		memcpy(websocket->ws_private.close_buffer.buffer + sizeof(ws_status_code), reason, copy_len);
		close_buffer_length += copy_len;
	}

	cio_write_buffer_head_init(&websocket->ws_private.close_buffer.wb_head);
	cio_write_buffer_element_init(&websocket->ws_private.close_buffer.write_buffer, websocket->ws_private.close_buffer.buffer, close_buffer_length);
	cio_write_buffer_queue_tail(&websocket->ws_private.close_buffer.wb_head, &websocket->ws_private.close_buffer.write_buffer);
	websocket->ws_private.write_close_job.wbh = &websocket->ws_private.close_buffer.wb_head;
	websocket->ws_private.write_close_job.handler = handler;
	websocket->ws_private.write_close_job.handler_context = handler_context;
	websocket->ws_private.write_close_job.frame_type = CIO_WEBSOCKET_CLOSE_FRAME;
	websocket->ws_private.write_close_job.last_frame = true;
	websocket->ws_private.write_close_job.stream_handler = stream_handler;
}